

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
 pybind11::detail::all_type_info_get_cache(PyTypeObject *type)

{
  undefined8 extraout_RDX;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  pVar1;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  pVar2;
  type local_60;
  handle local_58;
  PyObject *local_50;
  handle local_48;
  object local_40;
  _Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
  local_38;
  undefined1 local_30;
  anon_class_8_1_89923c38 local_28;
  PyTypeObject *local_20;
  PyTypeObject *type_local;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  res;
  
  local_28.type = type;
  local_20 = type;
  pVar1 = with_internals<pybind11::detail::all_type_info_get_cache(_typeobject*)::_lambda(pybind11::detail::internals&)_1_>
                    (&local_28);
  local_38._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
       ._M_cur;
  local_30 = pVar1.second;
  res.first.
  super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
  ._M_cur._0_1_ = local_30;
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    type_local = (PyTypeObject *)local_38._M_cur;
    handle::handle<_object_*,_0>(&local_48,(_object *)local_20);
    local_60.type = local_20;
    cpp_function::
    cpp_function<pybind11::detail::all_type_info_get_cache(_typeobject*)::_lambda(pybind11::handle)_1_,,void>
              ((cpp_function *)&local_58,&local_60);
    local_50 = local_58.m_ptr;
    weakref::weakref((weakref *)&local_40,local_48,local_58);
    object::release(&local_40);
    weakref::~weakref((weakref *)&local_40);
    cpp_function::~cpp_function((cpp_function *)&local_58);
    pVar1._8_8_ = extraout_RDX;
    pVar1.first.
    super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
    ._M_cur = (_Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
               )(_Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                 )type_local;
  }
  type_local = (PyTypeObject *)
               pVar1.first.
               super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
               ._M_cur;
  pVar2._9_7_ = pVar1._9_7_;
  pVar2.second = (bool)res.first.
                       super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                       ._M_cur._0_1_;
  pVar2.first.
  super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
             )(_Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
               )type_local;
  return pVar2;
}

Assistant:

inline std::pair<decltype(internals::registered_types_py)::iterator, bool>
all_type_info_get_cache(PyTypeObject *type) {
    auto res = with_internals([type](internals &internals) {
        return internals
            .registered_types_py
#ifdef __cpp_lib_unordered_map_try_emplace
            .try_emplace(type);
#else
            .emplace(type, std::vector<detail::type_info *>());
#endif
    });
    if (res.second) {
        // New cache entry created; set up a weak reference to automatically remove it if the type
        // gets destroyed:
        weakref((PyObject *) type, cpp_function([type](handle wr) {
                    with_internals([type](internals &internals) {
                        internals.registered_types_py.erase(type);

                        // TODO consolidate the erasure code in pybind11_meta_dealloc() in class.h
                        auto &cache = internals.inactive_override_cache;
                        for (auto it = cache.begin(), last = cache.end(); it != last;) {
                            if (it->first == reinterpret_cast<PyObject *>(type)) {
                                it = cache.erase(it);
                            } else {
                                ++it;
                            }
                        }
                    });

                    wr.dec_ref();
                }))
            .release();
    }

    return res;
}